

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

uchar * mkvparser::SafeArrayAlloc<unsigned_char>
                  (unsigned_long_long num_elements,unsigned_long_long element_size)

{
  undefined1 auVar1 [16];
  unsigned_long_long num_bytes;
  size_t kMaxAllocSize;
  unsigned_long_long element_size_local;
  unsigned_long_long num_elements_local;
  
  if ((num_elements == 0) || (element_size == 0)) {
    num_elements_local = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = num_elements;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x80000000)) / auVar1,0) < element_size) {
      num_elements_local = 0;
    }
    else {
      num_elements_local =
           (unsigned_long_long)
           operator_new__(num_elements * element_size,(nothrow_t *)&std::nothrow);
    }
  }
  return (uchar *)num_elements_local;
}

Assistant:

Type* SafeArrayAlloc(unsigned long long num_elements,
                     unsigned long long element_size) {
  if (num_elements == 0 || element_size == 0)
    return NULL;

  const size_t kMaxAllocSize = 0x80000000;  // 2GiB
  const unsigned long long num_bytes = num_elements * element_size;
  if (element_size > (kMaxAllocSize / num_elements))
    return NULL;
  if (num_bytes != static_cast<size_t>(num_bytes))
    return NULL;

  return new (std::nothrow) Type[static_cast<size_t>(num_bytes)];
}